

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_parse_ack(ikcpcb *kcp,IUINT32 sn)

{
  IQUEUEHEAD *pIVar1;
  IKCPSEG *seg;
  IQUEUEHEAD *next;
  IQUEUEHEAD *p;
  IUINT32 sn_local;
  ikcpcb *kcp_local;
  
  if ((-1 < (int)(sn - kcp->snd_una)) && ((int)(sn - kcp->snd_nxt) < 0)) {
    next = (kcp->snd_buf).next;
    do {
      if (next == &kcp->snd_buf) {
        return;
      }
      if (sn == *(IUINT32 *)((long)&next[2].next + 4)) {
        next->next->prev = next->prev;
        next->prev->next = next->next;
        next->next = (IQUEUEHEAD *)0x0;
        next->prev = (IQUEUEHEAD *)0x0;
        ikcp_segment_delete(kcp,(IKCPSEG *)next);
        kcp->nsnd_buf = kcp->nsnd_buf - 1;
        return;
      }
      pIVar1 = next + 2;
      next = next->next;
    } while (-1 < (int)(sn - *(int *)((long)&pIVar1->next + 4)));
  }
  return;
}

Assistant:

static void ikcp_parse_ack(ikcpcb *kcp, IUINT32 sn)
{
	struct IQUEUEHEAD *p, *next;

	if (_itimediff(sn, kcp->snd_una) < 0 || _itimediff(sn, kcp->snd_nxt) >= 0)
		return;

	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = next) {
		IKCPSEG *seg = iqueue_entry(p, IKCPSEG, node);
		next = p->next;
		if (sn == seg->sn) {
			iqueue_del(p);
			ikcp_segment_delete(kcp, seg);
			kcp->nsnd_buf--;
			break;
		}
		if (_itimediff(sn, seg->sn) < 0) {
			break;
		}
	}
}